

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

void __thiscall mir::inst::MirFunction::display(MirFunction *this,ostream *o)

{
  element_type *peVar1;
  element_type *peVar2;
  char cVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  _Self __tmp;
  pointer psVar6;
  char *pcVar7;
  
  peVar1 = (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  cVar3 = (char)o;
  if (peVar1->is_extern == true) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"extern fn ",10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
    psVar6 = (peVar1->params).
             super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar6 != (peVar1->params).
                  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (psVar6 != (peVar1->params).
                      super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
        }
        peVar2 = (psVar6->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,o);
        psVar6 = psVar6 + 1;
      } while (psVar6 != (peVar1->params).
                         super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,") -> ",5);
    peVar2 = (peVar1->ret).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,o);
    pcVar7 = ";";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(o,"fn ",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
    psVar6 = (peVar1->params).
             super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar6 != (peVar1->params).
                  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (psVar6 != (peVar1->params).
                      super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
        }
        peVar2 = (psVar6->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,o);
        psVar6 = psVar6 + 1;
      } while (psVar6 != (peVar1->params).
                         super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,") -> ",5);
    peVar2 = (peVar1->ret).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,o);
    std::__ostream_insert<char,std::char_traits<char>>(o," {",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    for (p_Var5 = (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->variables)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(o,"$",1);
      std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(o,": ",2);
      (**(code **)p_Var5[1]._M_parent)(&p_Var5[1]._M_parent,o);
      std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    pcVar7 = "}";
    for (p_Var5 = (this->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->basic_blks)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      (**(code **)p_Var5[1]._M_parent)(&p_Var5[1]._M_parent,o);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar7,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void MirFunction::display(std::ostream& o) const {
  auto& return_ty = type->ret;
  auto& params = type->params;
  if (type->is_extern) {
    o << "extern fn " << name << "(";
    for (auto i = params.begin(); i != params.end(); i++) {
      if (i != params.begin()) o << ", ";
      o << **i;
    }
    o << ") -> " << *return_ty << ";" << std::endl;
  } else {
    o << "fn " << name << "(";
    for (auto i = params.begin(); i != params.end(); i++) {
      if (i != params.begin()) o << ", ";
      o << **i;
    }
    o << ") -> " << *return_ty << " {" << std::endl;
    for (auto& i : variables) {
      o << "\t" << VarId(i.first) << ": " << i.second << std::endl;
      ;
    }
    for (auto i = basic_blks.begin(); i != basic_blks.end(); i++) {
      o << i->second;
    }
    o << "}" << std::endl;
  }
}